

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

test_handler_class * __thiscall
ccel::handler_pool<test_handler_class>::construct<int>
          (handler_pool<test_handler_class> *this,int *__args)

{
  logic_error *plVar1;
  int *piVar2;
  bad_alloc *this_00;
  element_type *peVar3;
  long in_RDI;
  bad_alloc *e;
  element_type *__tmp_ptr_holder;
  int *in_stack_ffffffffffffffb0;
  object_pool<test_handler_class,_boost::default_user_allocator_new_delete>
  *in_stack_ffffffffffffffb8;
  
  if ((*(long *)(in_RDI + 0x1b8) != 0) &&
     (*(ulong *)(in_RDI + 0x1b8) < *(long *)(in_RDI + 0x1a8) + 0x38U)) {
    plVar1 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar1,"Pool size limitation readched.");
    __cxa_throw(plVar1,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (*(long *)(in_RDI + 0x1c0) != 0) {
    in_stack_ffffffffffffffb0 = *(int **)(in_RDI + 0x1c0);
    piVar2 = (int *)std::numeric_limits<unsigned_long>::max();
    if (in_stack_ffffffffffffffb0 == piVar2) {
      if (*(long *)(in_RDI + 0x1b0) + 1U < *(ulong *)(in_RDI + 0x1c0)) {
        plVar1 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar1,"Pools handler limitation reached.");
        __cxa_throw(plVar1,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    else if (*(ulong *)(in_RDI + 0x1c0) < *(long *)(in_RDI + 0x1b0) + 1U) {
      this_00 = (bad_alloc *)__cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(this_00);
      __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  peVar3 = boost::object_pool<test_handler_class,_boost::default_user_allocator_new_delete>::
           construct<int>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  *(long *)(in_RDI + 0x1a8) = *(long *)(in_RDI + 0x1a8) + 0x38;
  *(long *)(in_RDI + 0x1b0) = *(long *)(in_RDI + 0x1b0) + 1;
  return peVar3;
}

Assistant:

_T_Handler *
  construct(Args &&... __args) { // The exception handling wrapper of
                                 // object_pool's construct func;
    if (_pool_size)              // there is a limitation of pool size (!=0)
      if (_size_allocated + sizeof(__handler_type) > _pool_size)
        throw std::logic_error("Pool size limitation readched.");
    // no limitation of pool size, need to avoid run out of memory
    if (_handler_limit) { // there is limitaions of handler numbers
      if (_handler_limit == std::numeric_limits<std::size_t>::max()) {
        // Ok,the limitation is the max of size_t
        if (_handler_count + 1 < _handler_limit) // reached the maxium
          throw std::logic_error("Pools handler limitation reached.");
      } else if (_handler_count + 1 > _handler_limit) // reaced maxium
        throw std::bad_alloc();
    }
    try {
      auto __tmp_ptr_holder = __handler_type::construct(
          std::forward<Args>(__args)...); // this may cause std::bad_alloc
      _size_allocated += sizeof(__handler_type);
      _handler_count++;
      return __tmp_ptr_holder;
    } catch (std::bad_alloc &e) { // oops,no memory
      return nullptr;             // no need to do handling
      // cuz there're no resource applied by this pool in the thrown
    } catch (...) {
      throw;
    } // rethrow other I-DONT-CARE exceptions
  }